

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::basic_substring<char>::first_not_of(basic_substring<char> *this,ro_substr chars,size_t start)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  
  uVar1 = this->len;
  if (uVar1 < start) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      sVar4 = (*pcVar2)();
      return sVar4;
    }
    handle_error(0x2467aa,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1756,"(start >= 0 && start <= len) || (start == len && len == 0)");
  }
  sVar4 = 0xffffffffffffffff;
  if (start < uVar1) {
    sVar5 = start;
    while (sVar4 = start, chars.len != 0) {
      sVar4 = 0;
      while (this->str[sVar5] != chars.str[sVar4]) {
        sVar4 = sVar4 + 1;
        if (chars.len == sVar4) {
          return sVar5;
        }
      }
      sVar5 = sVar5 + 1;
      if (sVar5 == uVar1) {
        return 0xffffffffffffffff;
      }
    }
  }
  return sVar4;
}

Assistant:

size_t first_not_of(ro_substr chars, size_t start=0) const
    {
        C4_ASSERT((start >= 0 && start <= len) || (start == len && len == 0));
        for(size_t i = start; i < len; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }